

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O1

bool __thiscall ftxui::SliderBase<long>::OnMouseEvent(SliderBase<long> *this,Event *event)

{
  CapturedMouseInterface *pCVar1;
  long *plVar2;
  CapturedMouseInterface *pCVar3;
  bool bVar4;
  long lVar5;
  CapturedMouseInterface *local_30;
  pointer local_28;
  
  pCVar1 = (this->captured_mouse_)._M_t.
           super___uniq_ptr_impl<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_ftxui::CapturedMouseInterface_*,_std::default_delete<ftxui::CapturedMouseInterface>_>
           .super__Head_base<0UL,_ftxui::CapturedMouseInterface_*,_false>._M_head_impl;
  if ((pCVar1 == (CapturedMouseInterface *)0x0) || ((event->field_1).mouse_.motion != Released)) {
    bVar4 = Box::Contain(&this->box_,(event->field_1).mouse_.x,(event->field_1).mouse_.y);
    if (bVar4) {
      ComponentBase::CaptureMouse((ComponentBase *)&local_28,(Event *)this);
      bVar4 = local_28 != (pointer)0x0;
      if (local_28 != (pointer)0x0) {
        (*(code *)(((local_28->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr)->children_).
                  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)();
      }
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      ComponentBase::TakeFocus(&this->super_ComponentBase);
    }
    if (((((event->field_1).mouse_.button == Left) && ((event->field_1).mouse_.motion == Pressed))
        && (bVar4 = Box::Contain(&this->gauge_box_,(event->field_1).mouse_.x,
                                 (event->field_1).mouse_.y), bVar4)) &&
       ((this->captured_mouse_)._M_t.
        super___uniq_ptr_impl<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
        ._M_t.
        super__Tuple_impl<0UL,_ftxui::CapturedMouseInterface_*,_std::default_delete<ftxui::CapturedMouseInterface>_>
        .super__Head_base<0UL,_ftxui::CapturedMouseInterface_*,_false>._M_head_impl ==
        (CapturedMouseInterface *)0x0)) {
      ComponentBase::CaptureMouse((ComponentBase *)&local_30,(Event *)this);
      pCVar3 = local_30;
      local_30 = (CapturedMouseInterface *)0x0;
      pCVar1 = (this->captured_mouse_)._M_t.
               super___uniq_ptr_impl<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_ftxui::CapturedMouseInterface_*,_std::default_delete<ftxui::CapturedMouseInterface>_>
               .super__Head_base<0UL,_ftxui::CapturedMouseInterface_*,_false>._M_head_impl;
      (this->captured_mouse_)._M_t.
      super___uniq_ptr_impl<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
      ._M_t.
      super__Tuple_impl<0UL,_ftxui::CapturedMouseInterface_*,_std::default_delete<ftxui::CapturedMouseInterface>_>
      .super__Head_base<0UL,_ftxui::CapturedMouseInterface_*,_false>._M_head_impl = pCVar3;
      if (pCVar1 != (CapturedMouseInterface *)0x0) {
        (*pCVar1->_vptr_CapturedMouseInterface[1])();
      }
      if (local_30 != (CapturedMouseInterface *)0x0) {
        (**(code **)(*(_func_int **)local_30 + 8))();
      }
    }
    if ((this->captured_mouse_)._M_t.
        super___uniq_ptr_impl<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
        ._M_t.
        super__Tuple_impl<0UL,_ftxui::CapturedMouseInterface_*,_std::default_delete<ftxui::CapturedMouseInterface>_>
        .super__Head_base<0UL,_ftxui::CapturedMouseInterface_*,_false>._M_head_impl ==
        (CapturedMouseInterface *)0x0) {
      return false;
    }
    plVar2 = this->value_;
    lVar5 = (long)(this->gauge_box_).x_min;
    lVar5 = ((this->max_ - this->min_) * ((event->field_1).mouse_.x - lVar5)) /
            ((this->gauge_box_).x_max - lVar5) + this->min_;
    *plVar2 = lVar5;
    if (this->max_ <= lVar5) {
      lVar5 = this->max_;
    }
    if (lVar5 < this->min_) {
      lVar5 = this->min_;
    }
    *plVar2 = lVar5;
  }
  else {
    (this->captured_mouse_)._M_t.
    super___uniq_ptr_impl<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
    ._M_t.
    super__Tuple_impl<0UL,_ftxui::CapturedMouseInterface_*,_std::default_delete<ftxui::CapturedMouseInterface>_>
    .super__Head_base<0UL,_ftxui::CapturedMouseInterface_*,_false>._M_head_impl =
         (CapturedMouseInterface *)0x0;
    (*pCVar1->_vptr_CapturedMouseInterface[1])();
  }
  return true;
}

Assistant:

bool OnMouseEvent(Event event) {
    if (captured_mouse_ && event.mouse().motion == Mouse::Released) {
      captured_mouse_ = nullptr;
      return true;
    }

    if (box_.Contain(event.mouse().x, event.mouse().y) && CaptureMouse(event)) {
      TakeFocus();
    }

    if (event.mouse().button == Mouse::Left &&
        event.mouse().motion == Mouse::Pressed &&
        gauge_box_.Contain(event.mouse().x, event.mouse().y) &&
        !captured_mouse_) {
      captured_mouse_ = CaptureMouse(event);
    }

    if (captured_mouse_) {
      *value_ = min_ + (event.mouse().x - gauge_box_.x_min) * (max_ - min_) /
                           (gauge_box_.x_max - gauge_box_.x_min);
      *value_ = std::max(min_, std::min(max_, *value_));
      return true;
    }
    return false;
  }